

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnExceptionType
          (BinaryReaderIR *this,Index index,TypeVector *sig)

{
  char *__s;
  Offset OVar1;
  undefined1 local_60 [8];
  Location loc;
  _Head_base<0UL,_wabt::ExceptionModuleField_*,_false> local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  local_60 = (undefined1  [8])__s;
  loc.filename.size_ = OVar1;
  MakeUnique<wabt::ExceptionModuleField,wabt::Location>
            ((wabt *)(loc.field_1.field2 + 8),(Location *)local_60);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(loc.field_1._8_8_ + 0x60),sig);
  local_38._M_head_impl = (ExceptionModuleField *)loc.field_1._8_8_;
  loc.field_1._8_8_ = 0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (ExceptionModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField
      ._vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (ExceptionModuleField *)0x0;
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExceptionType(Index index, TypeVector& sig) {
  auto field = MakeUnique<ExceptionModuleField>(GetLocation());
  Exception& except = field->except;
  except.sig = sig;
  module_->AppendField(std::move(field));
  return Result::Ok;
}